

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  uint fVerbose;
  char *pcVar4;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"svh"), iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x73) {
      Abc_Print(-2,"usage: sweep [-svh]\n");
      Abc_Print(-2,"\t        removes dangling nodes; propagates constant, buffers, inverters\n");
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (!bVar1) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s    : toggle sweeping buffers/inverters only [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h    : print the command usage\n";
      iVar2 = -2;
LAB_00205e6a:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else {
    if (pNtk->ntkType == ABC_NTK_LOGIC) {
      if (bVar1) {
        Abc_NtkSweepBufsInvs(pNtk,fVerbose);
      }
      else {
        Abc_NtkSweep(pNtk,fVerbose);
      }
      return 0;
    }
    pcVar3 = "The classical (SIS-like) sweep can only be performed on a logic network.\n";
  }
  iVar2 = -1;
  goto LAB_00205e6a;
}

Assistant:

int Abc_CommandSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fSingle = 0;
    int fVerbose = 0;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fSingle ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The classical (SIS-like) sweep can only be performed on a logic network.\n" );
        return 1;
    }
    // modify the current network
    if ( fSingle )
        Abc_NtkSweepBufsInvs( pNtk, fVerbose );
    else
        Abc_NtkSweep( pNtk, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: sweep [-svh]\n" );
    Abc_Print( -2, "\t        removes dangling nodes; propagates constant, buffers, inverters\n" );
    Abc_Print( -2, "\t-s    : toggle sweeping buffers/inverters only [default = %s]\n", fSingle? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}